

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O1

void duckdb::FirstFunctionString<false,true>::
     Operation<duckdb::string_t,duckdb::FirstState<duckdb::string_t>,duckdb::FirstFunctionString<false,true>>
               (FirstState<duckdb::string_t> *state,string_t *input,AggregateUnaryInput *unary_input
               )

{
  unsigned_long *puVar1;
  ulong in_R9;
  bool bVar2;
  string_t value;
  
  if (state->is_set != false) {
    return;
  }
  puVar1 = (unary_input->input_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    bVar2 = false;
  }
  else {
    in_R9 = unary_input->input_idx >> 6;
    bVar2 = (puVar1[in_R9] >> (unary_input->input_idx & 0x3f) & 1) == 0;
  }
  value.value.inlined.inlined[4] = bVar2;
  value.value._0_8_ = (input->value).pointer.ptr;
  value.value._9_7_ = 0;
  FirstFunctionStringBase<false,true>::SetValue<duckdb::FirstState<duckdb::string_t>,false>
            ((FirstFunctionStringBase<false,true> *)state,
             (FirstState<duckdb::string_t> *)unary_input->input,
             *(AggregateInputData **)&input->value,value,SUB81(in_R9,0));
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		if (LAST || !state.is_set) {
			FirstFunctionStringBase<LAST, SKIP_NULLS>::template SetValue<STATE>(state, unary_input.input, input,
			                                                                    !unary_input.RowIsValid());
		}
	}